

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepScanLineInputFile::readPixels
          (DeepScanLineInputFile *this,char *rawPixelData,DeepFrameBuffer *frameBuffer,int scanLine1
          ,int scanLine2)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Slice *pSVar4;
  int *piVar5;
  char *pcVar6;
  char *pcVar7;
  DeepSlice *pDVar8;
  int in_ECX;
  DeepFrameBuffer *in_RDX;
  uint *in_RSI;
  DeepScanLineInputFile *in_RDI;
  int in_R8D;
  double in_stack_00000050;
  bool in_stack_0000005b;
  int in_stack_0000005c;
  ptrdiff_t in_stack_00000060;
  ptrdiff_t in_stack_00000068;
  char *in_stack_00000070;
  char *in_stack_00000078;
  char **in_stack_00000080;
  int in_stack_00000090;
  int in_stack_00000098;
  int in_stack_000000a0;
  int in_stack_000000a8;
  int in_stack_000000b0;
  int in_stack_000000b8;
  ptrdiff_t in_stack_000000c0;
  ptrdiff_t in_stack_000000c8;
  ptrdiff_t in_stack_000000d0;
  Format in_stack_000000e0;
  PixelType in_stack_000000e8;
  PixelType in_stack_000000f0;
  bool fill;
  int x;
  char *ptr;
  ConstIterator j;
  ConstIterator i;
  int lineSampleCount;
  char *readPtr;
  int y;
  ChannelList *channels;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsetInLineBuffer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bytesPerLine;
  int maxYInLineBuffer;
  int minYInLineBuffer;
  int samplecount_ystride;
  int samplecount_xstride;
  char *samplecount_base;
  int dy;
  int yStop;
  int yStart;
  Format format;
  char *uncompressed_data;
  Compressor *decomp;
  uint64_t unpackedDataSize;
  uint64_t packedDataSize;
  uint64_t sampleCountTableDataSize;
  int data_scanline;
  undefined4 uVar9;
  DeepFrameBuffer *this_00;
  int in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  long in_stack_fffffffffffffd18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  size_t in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  Compression c;
  undefined8 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined8 in_stack_fffffffffffffd88;
  Header *in_stack_fffffffffffffd90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffda0;
  int local_144;
  int *local_140;
  int local_114;
  int local_104;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8 [2];
  undefined1 local_c8 [56];
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  size_t local_80;
  Compressor *local_78;
  double local_70;
  double local_68;
  long local_60;
  uint local_54;
  int local_50;
  int local_4c;
  DeepFrameBuffer *local_48;
  uint *local_40;
  
  c = (Compression)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  local_54 = *in_RSI;
  local_60 = *(long *)(in_RSI + 1);
  local_68 = *(double *)(in_RSI + 3);
  local_70 = *(double *)(in_RSI + 5);
  local_78 = (Compressor *)0x0;
  local_84 = 1;
  local_50 = in_R8D;
  local_4c = in_ECX;
  local_48 = in_RDX;
  if ((ulong)local_68 < (ulong)local_70) {
    local_40 = in_RSI;
    Header::compression((Header *)0x199d07);
    local_78 = newCompressor(c,in_stack_fffffffffffffd50,
                             (Header *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
                            );
    (*local_78->_vptr_Compressor[6])
              (local_78,(long)local_40 + local_60 + 0x1c,(ulong)local_68 & 0xffffffff,
               (ulong)local_54,&local_80);
    local_84 = (*local_78->_vptr_Compressor[3])();
  }
  else {
    local_84 = 1;
    local_80 = (long)in_RSI + local_60 + 0x1c;
  }
  if (in_RDI->_data->lineOrder == INCREASING_Y) {
    local_88 = local_4c;
    local_8c = local_50 + 1;
    local_90 = 1;
  }
  else {
    local_88 = local_50;
    local_8c = local_4c + -1;
    local_90 = -1;
  }
  pSVar4 = DeepFrameBuffer::getSampleCountSlice(local_48);
  local_c8._48_8_ = pSVar4->base;
  pSVar4 = DeepFrameBuffer::getSampleCountSlice(local_48);
  local_c8._44_4_ = (undefined4)pSVar4->xStride;
  pSVar4 = DeepFrameBuffer::getSampleCountSlice(local_48);
  local_c8._40_4_ = (undefined4)pSVar4->yStride;
  local_c8._36_4_ = local_54;
  local_c8._28_4_ = (local_54 - 1) + in_RDI->_data->linesInBuffer;
  piVar5 = std::min<int>((int *)(local_c8 + 0x1c),&in_RDI->_data->maxY);
  local_c8._32_4_ = *piVar5;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x199ef4);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
             (allocator_type *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x199f20);
  this_00 = (DeepFrameBuffer *)local_c8;
  bytesPerDeepLineTable
            (in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
             (int)in_stack_fffffffffffffd88,
             (char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
             (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),(int)in_stack_fffffffffffffd78,
             in_stack_fffffffffffffda0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x199f80);
  offsetInLineBufferTable
            (in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
             (int)in_stack_fffffffffffffd18,in_stack_fffffffffffffd14,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  header(in_RDI);
  Header::channels((Header *)0x199fd6);
  for (local_104 = local_88; local_104 != local_8c; local_104 = local_90 + local_104) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              (local_f8,(long)(local_104 - in_RDI->_data->minY));
    local_114 = -1;
    ChannelList::begin((ChannelList *)this_00);
    DeepFrameBuffer::begin(this_00);
    while( true ) {
      DeepFrameBuffer::end(this_00);
      bVar1 = Imf_3_2::operator!=((ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                                  (ConstIterator *)this_00);
      if (!bVar1) break;
      while( true ) {
        ChannelList::end((ChannelList *)this_00);
        bVar2 = Imf_3_2::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                                    (ConstIterator *)this_00);
        bVar1 = false;
        if (bVar2) {
          pcVar6 = ChannelList::ConstIterator::name((ConstIterator *)0x19a17f);
          pcVar7 = DeepFrameBuffer::ConstIterator::name((ConstIterator *)0x19a196);
          iVar3 = strcmp(pcVar6,pcVar7);
          bVar1 = iVar3 < 0;
        }
        if (!bVar1) break;
        if (local_114 == -1) {
          local_114 = 0;
          local_140 = (int *)(local_c8._48_8_ +
                             (long)(local_c8._44_4_ * in_RDI->_data->minX) +
                             (long)(local_104 * local_c8._40_4_));
          for (local_144 = in_RDI->_data->minX; local_144 <= in_RDI->_data->maxX;
              local_144 = local_144 + 1) {
            local_114 = *local_140 + local_114;
            local_140 = (int *)((long)local_140 + (long)(int)local_c8._44_4_);
          }
        }
        ChannelList::ConstIterator::channel((ConstIterator *)0x19a31c);
        skipChannel((char **)in_stack_fffffffffffffd20,
                    (PixelType)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                    CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        ChannelList::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
      }
      ChannelList::end((ChannelList *)this_00);
      bVar1 = Imf_3_2::operator==((ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                                  (ConstIterator *)this_00);
      if (!bVar1) {
        pcVar6 = ChannelList::ConstIterator::name((ConstIterator *)0x19a3cc);
        pcVar7 = DeepFrameBuffer::ConstIterator::name((ConstIterator *)0x19a3e3);
        strcmp(pcVar6,pcVar7);
      }
      ChannelList::ConstIterator::channel((ConstIterator *)0x19a43f);
      iVar3 = Imath_3_2::modp(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0);
      if (iVar3 == 0) {
        DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x19a476);
        uVar9 = (undefined4)((ulong)this_00 >> 0x20);
        iVar3 = in_RDI->_data->minX;
        in_stack_fffffffffffffcf0 = in_RDI->_data->maxX;
        pDVar8 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x19a505);
        in_stack_fffffffffffffd18 = (long)*(int *)&(pDVar8->super_Slice).field_0x34;
        pDVar8 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x19a530);
        in_stack_fffffffffffffd20 =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(pDVar8->super_Slice).xStride;
        DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x19a55b);
        DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x19a594);
        DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x19a5cf);
        ChannelList::ConstIterator::channel((ConstIterator *)0x19a5f7);
        this_00 = (DeepFrameBuffer *)CONCAT44(uVar9,iVar3);
        in_stack_fffffffffffffd10 = 0;
        in_stack_fffffffffffffd00 = 0;
        copyIntoDeepFrameBuffer
                  (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
                   in_stack_00000060,in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                   in_stack_000000a0,in_stack_000000a8,in_stack_000000b0,in_stack_000000b8,
                   in_stack_000000c0,in_stack_000000c8,in_stack_000000d0,in_stack_0000005b,
                   in_stack_00000050,in_stack_000000e0,in_stack_000000e8,in_stack_000000f0);
        ChannelList::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
      }
      DeepFrameBuffer::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
    }
  }
  if (local_78 != (Compressor *)0x0) {
    (*local_78->_vptr_Compressor[1])();
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  return;
}

Assistant:

void
DeepScanLineInputFile::readPixels (
    const char*            rawPixelData,
    const DeepFrameBuffer& frameBuffer,
    int                    scanLine1,
    int                    scanLine2) const
{
    //
    // read header from block - already converted from Xdr to native format
    //
    int      data_scanline            = *(int*) rawPixelData;
    uint64_t sampleCountTableDataSize = *(uint64_t*) (rawPixelData + 4);
    uint64_t packedDataSize           = *(uint64_t*) (rawPixelData + 12);
    uint64_t unpackedDataSize         = *(uint64_t*) (rawPixelData + 20);

    //
    // Uncompress the data, if necessary
    //

    Compressor*        decomp = NULL;
    const char*        uncompressed_data;
    Compressor::Format format = Compressor::XDR;
    if (packedDataSize < unpackedDataSize)
    {
        decomp = newCompressor (
            _data->header.compression (), unpackedDataSize, _data->header);

        decomp->uncompress (
            rawPixelData + 28 + sampleCountTableDataSize,
            static_cast<int> (packedDataSize),
            data_scanline,
            uncompressed_data);
        format = decomp->format ();
    }
    else
    {
        //
        // If the line is uncompressed, it's in XDR format,
        // regardless of the compressor's output format.
        //

        format            = Compressor::XDR;
        uncompressed_data = rawPixelData + 28 + sampleCountTableDataSize;
    }

    int yStart, yStop, dy;

    if (_data->lineOrder == INCREASING_Y)
    {
        yStart = scanLine1;
        yStop  = scanLine2 + 1;
        dy     = 1;
    }
    else
    {
        yStart = scanLine2;
        yStop  = scanLine1 - 1;
        dy     = -1;
    }

    const char* samplecount_base = frameBuffer.getSampleCountSlice ().base;
    int         samplecount_xstride =
        static_cast<int> (frameBuffer.getSampleCountSlice ().xStride);
    int samplecount_ystride =
        static_cast<int> (frameBuffer.getSampleCountSlice ().yStride);

    //
    // For each line within the block, get the count of bytes.
    //

    int minYInLineBuffer = data_scanline;
    int maxYInLineBuffer =
        min (minYInLineBuffer + _data->linesInBuffer - 1, _data->maxY);

    vector<size_t> bytesPerLine (1 + _data->maxY - _data->minY);

    bytesPerDeepLineTable (
        _data->header,
        minYInLineBuffer,
        maxYInLineBuffer,
        samplecount_base,
        samplecount_xstride,
        samplecount_ystride,
        bytesPerLine);

    //
    // For each scanline within the block, get the offset.
    //

    vector<size_t> offsetInLineBuffer;
    offsetInLineBufferTable (
        bytesPerLine,
        minYInLineBuffer - _data->minY,
        maxYInLineBuffer - _data->minY,
        _data->linesInBuffer,
        offsetInLineBuffer);

    const ChannelList& channels = header ().channels ();

    for (int y = yStart; y != yStop; y += dy)
    {

        const char* readPtr =
            uncompressed_data + offsetInLineBuffer[y - _data->minY];

        //
        // need to know the total number of samples on a scanline to skip channels
        // compute on demand: -1 means uncomputed
        //
        int lineSampleCount = -1;

        //
        // Iterate over all image channels in frame buffer
        //

        ChannelList::ConstIterator i = channels.begin ();

        for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin ();
             j != frameBuffer.end ();
             ++j)
        {
            while (i != channels.end () && strcmp (i.name (), j.name ()) < 0)
            {
                //
                // Channel i is present in the file but not
                // in the frame buffer; skip

                if (lineSampleCount == -1)
                {
                    lineSampleCount = 0;
                    const char* ptr =
                        (samplecount_base + y * samplecount_ystride +
                         samplecount_xstride * _data->minX);
                    for (int x = _data->minX; x <= _data->maxX; x++)
                    {

                        lineSampleCount += *(const unsigned int*) ptr;
                        ptr += samplecount_xstride;
                    }
                }

                skipChannel (readPtr, i.channel ().type, lineSampleCount);

                ++i;
            }

            bool fill = false;

            if (i == channels.end () || strcmp (i.name (), j.name ()) > 0)
            {
                //
                // Channel i is present in the frame buffer, but not in the file.
                // In the frame buffer, slice j will be filled with a default value.
                //

                fill = true;
            }
            if (modp (y, i.channel ().ySampling) == 0)
            {

                copyIntoDeepFrameBuffer (
                    readPtr,
                    j.slice ().base,
                    samplecount_base,
                    samplecount_xstride,
                    samplecount_ystride,
                    y,
                    _data->minX,
                    _data->maxX,
                    0,
                    0,
                    0,
                    0,
                    j.slice ().sampleStride,
                    j.slice ().xStride,
                    j.slice ().yStride,
                    fill,
                    j.slice ().fillValue,
                    format,
                    j.slice ().type,
                    i.channel ().type);

                ++i;
            }
        } //next slice in framebuffer
    }     //next row in image

    //
    // clean up
    //

    delete decomp;
}